

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbb.cc
# Opt level: O1

int cbb_add_child(CBB *cbb,CBB *out_child,uint8_t len_len,int is_asn1)

{
  size_t sVar1;
  int iVar2;
  cbb_buffer_st *base;
  ulong len;
  uint8_t *prefix_bytes;
  uint8_t *local_38;
  
  if (cbb->child != (CBB *)0x0) {
    __assert_fail("cbb->child == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/cbb.cc"
                  ,0x127,"int cbb_add_child(CBB *, CBB *, uint8_t, int)");
  }
  if (len_len == '\x01' || is_asn1 == 0) {
    base = (cbb_buffer_st *)&cbb->u;
    if (cbb->is_child != '\0') {
      base = ((cbb_child_st *)base)->base;
    }
    sVar1 = base->len;
    len = (ulong)len_len;
    iVar2 = cbb_buffer_reserve(base,&local_38,len);
    if (iVar2 == 0) {
      iVar2 = 0;
    }
    else {
      base->len = base->len + len;
      if (len_len != '\0') {
        memset(local_38,0,len);
      }
      out_child->child = (CBB *)0x0;
      *(undefined8 *)&out_child->is_child = 0;
      (out_child->u).base.buf = (uint8_t *)0x0;
      (out_child->u).base.len = 0;
      (out_child->u).base.cap = 0;
      *(undefined8 *)((long)&out_child->u + 0x18) = 0;
      out_child->is_child = '\x01';
      (out_child->u).child.base = base;
      (out_child->u).base.len = sVar1;
      (out_child->u).child.pending_len_len = len_len;
      *(byte *)((long)&out_child->u + 0x11) =
           *(byte *)((long)&out_child->u + 0x11) & 0xfe | (byte)is_asn1 & 1;
      cbb->child = out_child;
      iVar2 = 1;
    }
    return iVar2;
  }
  __assert_fail("!is_asn1 || len_len == 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/cbb.cc"
                ,0x128,"int cbb_add_child(CBB *, CBB *, uint8_t, int)");
}

Assistant:

static int cbb_add_child(CBB *cbb, CBB *out_child, uint8_t len_len,
                         int is_asn1) {
  assert(cbb->child == NULL);
  assert(!is_asn1 || len_len == 1);
  struct cbb_buffer_st *base = cbb_get_base(cbb);
  size_t offset = base->len;

  // Reserve space for the length prefix.
  uint8_t *prefix_bytes;
  if (!cbb_buffer_add(base, &prefix_bytes, len_len)) {
    return 0;
  }
  OPENSSL_memset(prefix_bytes, 0, len_len);

  CBB_zero(out_child);
  out_child->is_child = 1;
  out_child->u.child.base = base;
  out_child->u.child.offset = offset;
  out_child->u.child.pending_len_len = len_len;
  out_child->u.child.pending_is_asn1 = is_asn1;
  cbb->child = out_child;
  return 1;
}